

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall ftxui::InputBase::~InputBase(InputBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  function<void_()> *pfVar3;
  Ref<ftxui::InputOption> *pRVar4;
  pointer pwVar5;
  pointer pcVar6;
  _Manager_type p_Var7;
  
  (this->super_WideInputBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__InputBase_001752c8;
  pwVar5 = (this->wrapped_content_)._M_dataplus._M_p;
  paVar1 = &(this->wrapped_content_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar5 != paVar1) {
    operator_delete(pwVar5,paVar1->_M_allocated_capacity * 4 + 4);
  }
  pcVar6 = (this->content_).owned_._M_dataplus._M_p;
  paVar2 = &(this->content_).owned_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar2) {
    operator_delete(pcVar6,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_WideInputBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__WideInputBase_00175340;
  p_Var7 = (this->super_WideInputBase).option_.owned_.on_enter.super__Function_base._M_manager;
  if (p_Var7 != (_Manager_type)0x0) {
    pfVar3 = &(this->super_WideInputBase).option_.owned_.on_enter;
    (*p_Var7)((_Any_data *)pfVar3,(_Any_data *)pfVar3,__destroy_functor);
  }
  p_Var7 = (this->super_WideInputBase).option_.owned_.on_change.super__Function_base._M_manager;
  if (p_Var7 != (_Manager_type)0x0) {
    pRVar4 = &(this->super_WideInputBase).option_;
    (*p_Var7)((_Any_data *)pRVar4,(_Any_data *)pRVar4,__destroy_functor);
  }
  pcVar6 = (this->super_WideInputBase).placeholder_.owned_._M_dataplus._M_p;
  paVar2 = &(this->super_WideInputBase).placeholder_.owned_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar2) {
    operator_delete(pcVar6,paVar2->_M_allocated_capacity + 1);
  }
  pwVar5 = (this->super_WideInputBase).content_.owned_._M_dataplus._M_p;
  paVar1 = &(this->super_WideInputBase).content_.owned_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar5 != paVar1) {
    operator_delete(pwVar5,paVar1->_M_allocated_capacity * 4 + 4);
  }
  ComponentBase::~ComponentBase((ComponentBase *)this);
  return;
}

Assistant:

InputBase(StringRef content,
            ConstStringRef placeholder,
            Ref<InputOption> option)
      : WideInputBase(&wrapped_content_,
                      std::move(placeholder),
                      std::move(option)),
        content_(std::move(content)),
        wrapped_content_(to_wstring(*content_)) {}